

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void __thiscall
pstore::broker::command_processor::suicide
          (command_processor *this,fifo_path *param_1,broker_command *param_2)

{
  element_type *peVar1;
  undefined1 local_30 [8];
  shared_ptr<pstore::broker::scavenger> scav;
  broker_command *param_2_local;
  fifo_path *param_1_local;
  command_processor *this_local;
  
  scav.super___shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)param_2;
  atomic_weak_ptr<pstore::broker::scavenger>::get
            ((atomic_weak_ptr<pstore::broker::scavenger> *)local_30);
  peVar1 = std::__shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2> *)
                      local_30);
  shutdown((int)this,(int)peVar1);
  std::shared_ptr<pstore::broker::scavenger>::~shared_ptr
            ((shared_ptr<pstore::broker::scavenger> *)local_30);
  return;
}

Assistant:

void command_processor::suicide (brokerface::fifo_path const &, broker_command const &) {
            std::shared_ptr<scavenger> const scav = scavenger_.get ();
            shutdown (this, scav.get (), sig_self_quit, num_read_threads_, http_status_,
                      uptime_done_);
        }